

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.h
# Opt level: O0

double __thiscall
mp::internal::BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>::
VisitUnary(BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector> *this,
          UnaryExpr e)

{
  Impl *pIVar1;
  Kind KVar2;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> BVar3;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  *in_RDI;
  double result;
  double saved_coef;
  BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
  *in_stack_00000430;
  ExprBase in_stack_00000438;
  BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
  *in_stack_ffffffffffffffc8;
  ExprBase in_stack_ffffffffffffffd0;
  double local_8;
  
  KVar2 = ExprBase::kind((ExprBase *)0x1cbfc1);
  if (KVar2 == FIRST_UNARY) {
    pIVar1 = in_RDI[6].super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_;
    in_RDI[6].super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_ =
         (Impl *)((ulong)in_RDI[6].super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.
                         super_ExprBase.impl_ ^ 0x8000000000000000);
    BVar3 = BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
            ::arg(in_RDI);
    BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_ffffffffffffffc8,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffffd0.impl_,
               BVar3.super_ExprBase.impl_._4_4_);
    local_8 = BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
              ::Visit(in_stack_00000430,(Expr)in_stack_00000438.impl_);
    local_8 = -local_8;
    in_RDI[6].super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_ = pIVar1;
  }
  else {
    local_8 = BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
              ::VisitUnary(in_stack_ffffffffffffffc8,(UnaryExpr)in_stack_ffffffffffffffd0.impl_);
  }
  return local_8;
}

Assistant:

double VisitUnary(UnaryExpr e) {
    if (e.kind() != expr::MINUS)
      return Base::VisitUnary(e);
    double saved_coef = coef_;
    coef_ = -coef_;
    double result = -this->Visit(e.arg());
    coef_ = saved_coef;
    return result;
  }